

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void Excel::Parser::handleLabel(Record *record,size_t sheetIdx,IStorage *storage)

{
  Stream *pSVar1;
  long *in_RDX;
  undefined8 in_RSI;
  Record *in_RDI;
  undefined8 in_R9;
  Stream *unaff_retaddr;
  wstring data;
  int16_t column;
  int16_t row;
  BiffVersion in_stack_000000f8;
  int32_t in_stack_000000fc;
  vector<int,_std::allocator<int>_> *in_stack_00000100;
  Stream *in_stack_00000108;
  wstring local_40 [36];
  short local_1c;
  short local_1a;
  long *local_18;
  
  local_1a = 0;
  local_1c = 0;
  local_18 = in_RDX;
  Record::dataStream(in_RDI);
  Stream::read<short>(unaff_retaddr,(short *)in_RDI,(int32_t)((ulong)in_RSI >> 0x20));
  Record::dataStream(in_RDI);
  Stream::read<short>(unaff_retaddr,(short *)in_RDI,(int32_t)((ulong)in_RSI >> 0x20));
  pSVar1 = Record::dataStream(in_RDI);
  (*pSVar1->_vptr_Stream[4])(pSVar1,2,1);
  pSVar1 = Record::dataStream(in_RDI);
  Record::borders(in_RDI);
  loadString_abi_cxx11_(in_stack_00000108,in_stack_00000100,in_stack_000000fc,in_stack_000000f8);
  (**(code **)(*local_18 + 0x30))
            (local_18,in_RSI,(long)local_1a,(long)local_1c,local_40,in_R9,pSVar1);
  std::__cxx11::wstring::~wstring(local_40);
  return;
}

Assistant:

inline void
Parser::handleLabel( Record & record, size_t sheetIdx, IStorage & storage )
{
	int16_t row = 0;
	int16_t column = 0;

	record.dataStream().read( row, 2 );
	record.dataStream().read( column, 2 );
	record.dataStream().seek( 2, Excel::Stream::FromCurrent );
	const auto data = loadString( record.dataStream(), record.borders(), 2, BOF::BIFF7 );

	storage.onCell( sheetIdx, row, column, data );
}